

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty_test_pe.cc
# Opt level: O3

void Normalize(string *contents)

{
  char cVar1;
  istream *piVar2;
  long lVar3;
  string tmp;
  stringstream buffer;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  long *local_1d8 [2];
  long local_1c8 [2];
  long local_1b8 [16];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream
            ((stringstream *)local_1b8,(string *)contents,_S_out|_S_in);
  contents->_M_string_length = 0;
  *(contents->_M_dataplus)._M_p = '\0';
  local_1f8 = &local_1e8;
  local_1f0 = 0;
  local_1e8 = 0;
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_1b8[0] + -0x18) +
                            (char)(stringstream *)local_1b8);
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b8,(string *)&local_1f8,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    lVar3 = std::__cxx11::string::find_last_not_of((char *)&local_1f8,0x33400c,0xffffffffffffffff);
    if (lVar3 == -1) {
      local_1f0 = 0;
      *local_1f8 = 0;
    }
    else {
      std::__cxx11::string::substr((ulong)local_1d8,(ulong)&local_1f8);
      std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1d8);
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0],local_1c8[0] + 1);
      }
    }
    if (contents->_M_string_length != 0) {
      std::__cxx11::string::append((char *)contents);
    }
    std::__cxx11::string::_M_append((char *)contents,(ulong)local_1f8);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Normalize(std::string& contents) {
  std::stringstream buffer(contents);
  contents.clear();
  std::string tmp;
  while (std::getline(buffer, tmp)) {
    auto end = tmp.find_last_not_of("\t \r");
    if (end != std::string::npos) {
      tmp = tmp.substr(0, end + 1);
    }
    else {
      tmp.clear();
    }
    if (!contents.empty()) {
      contents += "\n";
    }
    contents += tmp;
  }
}